

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::copyEncryptionParameters(QPDFWriter *this,QPDF *qpdf)

{
  element_type *peVar1;
  bool bVar2;
  int V;
  int R;
  longlong lVar3;
  string *user_password;
  string OE;
  allocator<char> local_1bc;
  allocator<char> local_1bb;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  QPDFObjectHandle encrypt;
  string UE;
  int local_184;
  string local_180;
  string local_160 [32];
  string Perms;
  string local_120;
  QPDFObjectHandle trailer;
  string encryption_key;
  QPDFObjectHandle local_d0;
  QPDFObjectHandle local_c0;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  allocator<char> local_90 [32];
  string local_70 [32];
  string local_50;
  
  ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  preserve_encryption = false;
  QPDF::getTrailer((QPDF *)&trailer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&OE,"/Encrypt",(allocator<char> *)&UE);
  bVar2 = QPDFObjectHandle::hasKey(&trailer,&OE);
  std::__cxx11::string::~string((string *)&OE);
  if (!bVar2) goto LAB_001b3a4b;
  generateID(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&UE,"/ID",(allocator<char> *)&local_120);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&encryption_key,(string *)&trailer);
  QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&Perms,(int)&encryption_key);
  QPDFObjectHandle::getStringValue_abi_cxx11_(&OE,(QPDFObjectHandle *)&Perms);
  std::__cxx11::string::operator=
            ((string *)
             &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->id1,(string *)&OE);
  std::__cxx11::string::~string((string *)&OE);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&Perms._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&encryption_key._M_string_length);
  std::__cxx11::string::~string((string *)&UE);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&OE,"/Encrypt",(allocator<char> *)&UE);
  QPDFObjectHandle::getKey(&encrypt,(string *)&trailer);
  std::__cxx11::string::~string((string *)&OE);
  std::__cxx11::string::string<std::allocator<char>>((string *)&OE,"/V",(allocator<char> *)&Perms);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&UE,(string *)&encrypt);
  V = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&UE);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&UE._M_string_length);
  std::__cxx11::string::~string((string *)&OE);
  if (V < 2) {
    local_184 = 5;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&OE,"/Length",(allocator<char> *)&Perms);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&UE,(string *)&encrypt);
    local_184 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&UE);
    local_184 = local_184 / 8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&UE._M_string_length);
    std::__cxx11::string::~string((string *)&OE);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&OE,"/EncryptMetadata",(allocator<char> *)&encryption_key);
  bVar2 = QPDFObjectHandle::hasKey(&encrypt,&OE);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&UE,"/EncryptMetadata",(allocator<char> *)&local_120);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&Perms,(string *)&encrypt);
    bVar2 = QPDFObjectHandle::isBool((QPDFObjectHandle *)&Perms);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&Perms._M_string_length);
    std::__cxx11::string::~string((string *)&UE);
    std::__cxx11::string::~string((string *)&OE);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&OE,"/EncryptMetadata",(allocator<char> *)&Perms);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&UE,(string *)&encrypt);
      bVar2 = QPDFObjectHandle::getBoolValue((QPDFObjectHandle *)&UE);
      ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      encrypt_metadata = bVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&UE._M_string_length);
      goto LAB_001b3619;
    }
  }
  else {
LAB_001b3619:
    std::__cxx11::string::~string((string *)&OE);
  }
  if (3 < V) {
    ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    encrypt_use_aes = true;
  }
  OE._M_dataplus._M_p = (pointer)&OE.field_2;
  OE._M_string_length = 0;
  UE._M_dataplus._M_p = (pointer)&UE.field_2;
  UE._M_string_length = 0;
  OE.field_2._M_local_buf[0] = '\0';
  Perms._M_dataplus._M_p = (pointer)&Perms.field_2;
  Perms._M_string_length = 0;
  encryption_key._M_dataplus._M_p = (pointer)&encryption_key.field_2;
  encryption_key._M_string_length = 0;
  UE.field_2._M_local_buf[0] = '\0';
  Perms.field_2._M_local_buf[0] = '\0';
  encryption_key.field_2._M_local_buf[0] = '\0';
  if (4 < V) {
    std::__cxx11::string::string<std::allocator<char>>(local_160,"/OE",local_90);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_180,(string *)&encrypt);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_120,(QPDFObjectHandle *)&local_180);
    std::__cxx11::string::operator=((string *)&OE,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180._M_string_length);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::string<std::allocator<char>>(local_160,"/UE",local_90);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_180,(string *)&encrypt);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_120,(QPDFObjectHandle *)&local_180);
    std::__cxx11::string::operator=((string *)&UE,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180._M_string_length);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::string<std::allocator<char>>(local_160,"/Perms",local_90);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_180,(string *)&encrypt);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_120,(QPDFObjectHandle *)&local_180);
    std::__cxx11::string::operator=((string *)&Perms,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180._M_string_length);
    std::__cxx11::string::~string(local_160);
    QPDF::getEncryptionKey_abi_cxx11_(&local_120,qpdf);
    std::__cxx11::string::operator=((string *)&encryption_key,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"/R",&local_1b9);
  QPDFObjectHandle::getKey(&local_a0,(string *)&encrypt);
  R = QPDFObjectHandle::getIntValueAsInt(&local_a0);
  std::__cxx11::string::string<std::allocator<char>>(local_160,"/P",&local_1ba);
  QPDFObjectHandle::getKey(&local_b0,(string *)&encrypt);
  lVar3 = QPDFObjectHandle::getIntValue(&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"/O",&local_1bb);
  QPDFObjectHandle::getKey(&local_c0,(string *)&encrypt);
  QPDFObjectHandle::getStringValue_abi_cxx11_(&local_180,&local_c0);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"/U",&local_1bc);
  QPDFObjectHandle::getKey(&local_d0,(string *)&encrypt);
  QPDFObjectHandle::getStringValue_abi_cxx11_(&local_50,&local_d0);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  user_password = QPDF::getPaddedUserPassword_abi_cxx11_(qpdf);
  setEncryptionParametersInternal
            (this,V,R,local_184,(int)lVar3,&local_180,&local_50,&OE,&UE,&Perms,&peVar1->id1,
             user_password,&encryption_key);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&encryption_key);
  std::__cxx11::string::~string((string *)&Perms);
  std::__cxx11::string::~string((string *)&UE);
  std::__cxx11::string::~string((string *)&OE);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&encrypt.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001b3a4b:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFWriter::copyEncryptionParameters(QPDF& qpdf)
{
    m->preserve_encryption = false;
    QPDFObjectHandle trailer = qpdf.getTrailer();
    if (trailer.hasKey("/Encrypt")) {
        generateID();
        m->id1 = trailer.getKey("/ID").getArrayItem(0).getStringValue();
        QPDFObjectHandle encrypt = trailer.getKey("/Encrypt");
        int V = encrypt.getKey("/V").getIntValueAsInt();
        int key_len = 5;
        if (V > 1) {
            key_len = encrypt.getKey("/Length").getIntValueAsInt() / 8;
        }
        if (encrypt.hasKey("/EncryptMetadata") && encrypt.getKey("/EncryptMetadata").isBool()) {
            m->encrypt_metadata = encrypt.getKey("/EncryptMetadata").getBoolValue();
        }
        if (V >= 4) {
            // When copying encryption parameters, use AES even if the original file did not.
            // Acrobat doesn't create files with V >= 4 that don't use AES, and the logic of
            // figuring out whether AES is used or not is complicated with /StmF, /StrF, and /EFF
            // all potentially having different values.
            m->encrypt_use_aes = true;
        }
        QTC::TC("qpdf", "QPDFWriter copy encrypt metadata", m->encrypt_metadata ? 0 : 1);
        QTC::TC("qpdf", "QPDFWriter copy use_aes", m->encrypt_use_aes ? 0 : 1);
        std::string OE;
        std::string UE;
        std::string Perms;
        std::string encryption_key;
        if (V >= 5) {
            QTC::TC("qpdf", "QPDFWriter copy V5");
            OE = encrypt.getKey("/OE").getStringValue();
            UE = encrypt.getKey("/UE").getStringValue();
            Perms = encrypt.getKey("/Perms").getStringValue();
            encryption_key = qpdf.getEncryptionKey();
        }

        setEncryptionParametersInternal(
            V,
            encrypt.getKey("/R").getIntValueAsInt(),
            key_len,
            static_cast<int>(encrypt.getKey("/P").getIntValue()),
            encrypt.getKey("/O").getStringValue(),
            encrypt.getKey("/U").getStringValue(),
            OE,
            UE,
            Perms,
            m->id1, // m->id1 == the other file's id1
            qpdf.getPaddedUserPassword(),
            encryption_key);
    }
}